

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

void __thiscall foxxll::request::check_nref_failed(request *this,bool after)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  Logger local_190;
  
  tlx::Logger::Logger(&local_190);
  std::operator<<((ostream *)&local_190,"WARNING: serious error, reference to the request is lost ")
  ;
  pcVar2 = "before";
  if (after) {
    pcVar2 = "after";
  }
  std::operator<<((ostream *)&local_190,pcVar2);
  std::operator<<((ostream *)&local_190," serve()");
  std::operator<<((ostream *)&local_190," nref=");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::operator<<((ostream *)&local_190," this=");
  std::ostream::_M_insert<void_const*>(&local_190);
  std::operator<<((ostream *)&local_190," offset=");
  tlx::LoggerFormatter<unsigned_long,_void>::print((ostream *)&local_190,&this->offset_);
  std::operator<<((ostream *)&local_190," buffer=");
  tlx::LoggerFormatter<void_*,_void>::print((ostream *)&local_190,&this->buffer_);
  std::operator<<((ostream *)&local_190," bytes=");
  tlx::LoggerFormatter<unsigned_long,_void>::print((ostream *)&local_190,&this->bytes_);
  std::operator<<((ostream *)&local_190," op=");
  pcVar2 = "WRITE";
  if (this->op_ == READ) {
    pcVar2 = "READ";
  }
  std::operator<<((ostream *)&local_190,pcVar2);
  std::operator<<((ostream *)&local_190," file=");
  tlx::LoggerFormatter<foxxll::file_*,_void>::print((ostream *)&local_190,&this->file_);
  std::operator<<((ostream *)&local_190," iotype=");
  iVar1 = (*this->file_->_vptr_file[0xd])();
  std::operator<<((ostream *)&local_190,(char *)CONCAT44(extraout_var,iVar1));
  tlx::Logger::~Logger(&local_190);
  return;
}

Assistant:

void request::check_nref_failed(bool after)
{
    TLX_LOG1 << "WARNING: serious error, reference to the request is lost " <<
    (after ? "after" : "before") << " serve()" <<
        " nref=" << reference_count() <<
        " this=" << this <<
        " offset=" << offset_ <<
        " buffer=" << buffer_ <<
        " bytes=" << bytes_ <<
        " op=" << ((op_ == READ) ? "READ" : "WRITE") <<
        " file=" << file_ <<
        " iotype=" << file_->io_type();
}